

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void whereInfoFree(sqlite3 *db,WhereInfo *pWInfo)

{
  WhereLoop *p_00;
  byte bVar1;
  ulong uVar2;
  WhereLoop *p;
  WhereLoop **ppWVar3;
  
  bVar1 = pWInfo->nLevel;
  if (bVar1 != 0) {
    ppWVar3 = &pWInfo->a[0].pWLoop;
    uVar2 = 0;
    do {
      if (((*ppWVar3 != (WhereLoop *)0x0) && (((*ppWVar3)->wsFlags & 0x800) != 0)) &&
         (ppWVar3[-1] != (WhereLoop *)0x0)) {
        sqlite3DbFreeNN(db,ppWVar3[-1]);
        bVar1 = pWInfo->nLevel;
      }
      uVar2 = uVar2 + 1;
      ppWVar3 = ppWVar3 + 0xb;
    } while (uVar2 < bVar1);
  }
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while (p_00 = pWInfo->pLoops, p_00 != (WhereLoop *)0x0) {
    pWInfo->pLoops = p_00->pNextLoop;
    whereLoopClear(db,p_00);
    sqlite3DbFreeNN(db,p_00);
  }
  sqlite3DbFreeNN(db,pWInfo);
  return;
}

Assistant:

static void whereInfoFree(sqlite3 *db, WhereInfo *pWInfo){
  int i;
  assert( pWInfo!=0 );
  for(i=0; i<pWInfo->nLevel; i++){
    WhereLevel *pLevel = &pWInfo->a[i];
    if( pLevel->pWLoop && (pLevel->pWLoop->wsFlags & WHERE_IN_ABLE) ){
      sqlite3DbFree(db, pLevel->u.in.aInLoop);
    }
  }
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while( pWInfo->pLoops ){
    WhereLoop *p = pWInfo->pLoops;
    pWInfo->pLoops = p->pNextLoop;
    whereLoopDelete(db, p);
  }
  sqlite3DbFreeNN(db, pWInfo);
}